

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_reset_min_row_height(nk_context *ctx)

{
  float fVar1;
  nk_panel *pnVar2;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x442b,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x442c,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x442d,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar2 = ctx->current->layout;
    (pnVar2->row).min_height = ((ctx->style).font)->height;
    fVar1 = (ctx->style).text.padding.y;
    (pnVar2->row).min_height = fVar1 + fVar1 + (pnVar2->row).min_height;
    fVar1 = (ctx->style).window.min_row_height_padding;
    (pnVar2->row).min_height = fVar1 + fVar1 + (pnVar2->row).min_height;
  }
  return;
}

Assistant:

NK_API void
nk_layout_reset_min_row_height(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    layout->row.min_height = ctx->style.font->height;
    layout->row.min_height += ctx->style.text.padding.y*2;
    layout->row.min_height += ctx->style.window.min_row_height_padding*2;
}